

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteSparse_config.c
# Opt level: O0

void * SuiteSparse_realloc(size_t nitems_new,size_t nitems_old,size_t size_of_item,void *p,int *ok)

{
  size_t __size;
  void *pvVar1;
  void *in_RCX;
  long in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  uint *in_R8;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  void *pnew;
  size_t size;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  if (in_RSI == 0) {
    local_10 = 1;
  }
  local_8 = in_RDI;
  if (in_RDI == 0) {
    local_8 = 1;
  }
  local_18 = in_RDX;
  if (in_RDX == 0) {
    local_18 = 1;
  }
  __size = local_8 * local_18;
  auVar3._8_4_ = (int)(__size >> 0x20);
  auVar3._0_8_ = __size;
  auVar3._12_4_ = 0x45300000;
  dVar2 = (auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)__size) - 4503599627370496.0);
  auVar5._8_4_ = (int)(local_8 >> 0x20);
  auVar5._0_8_ = local_8;
  auVar5._12_4_ = 0x45300000;
  auVar6._8_4_ = (int)((ulong)local_18 >> 0x20);
  auVar6._0_8_ = local_18;
  auVar6._12_4_ = 0x45300000;
  dVar4 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_8) - 4503599627370496.0)) *
          ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0));
  if ((dVar2 != dVar4) || (NAN(dVar2) || NAN(dVar4))) {
    *in_R8 = 0;
  }
  else if (in_RCX == (void *)0x0) {
    in_RCX = SuiteSparse_malloc(0,(size_t)in_R8);
    *in_R8 = (uint)(in_RCX != (void *)0x0);
  }
  else if (local_10 == local_8) {
    *in_R8 = 1;
  }
  else {
    pvVar1 = realloc(in_RCX,__size);
    if (pvVar1 == (void *)0x0) {
      if (local_8 < local_10) {
        *in_R8 = 1;
      }
      else {
        *in_R8 = 0;
      }
    }
    else {
      *in_R8 = 1;
      in_RCX = pvVar1;
    }
  }
  return in_RCX;
}

Assistant:

void *SuiteSparse_realloc   /* pointer to reallocated block of memory, or
                               to original block if the realloc failed. */
(
    size_t nitems_new,      /* new number of items in the object */
    size_t nitems_old,      /* old number of items in the object */
    size_t size_of_item,    /* sizeof each item */
    void *p,                /* old object to reallocate */
    int *ok                 /* 1 if successful, 0 otherwise */
)
{
    size_t size ;
    if (nitems_old < 1) nitems_old = 1 ;
    if (nitems_new < 1) nitems_new = 1 ;
    if (size_of_item < 1) size_of_item = 1 ;
    size = nitems_new * size_of_item  ;

    if (size != ((c_float) nitems_new) * size_of_item)
    {
        /* size_t overflow */
        (*ok) = 0 ;
    }
    else if (p == NULL)
    {
        /* a fresh object is being allocated */
        p = SuiteSparse_malloc (nitems_new, size_of_item) ;
        (*ok) = (p != NULL) ;
    }
    else if (nitems_old == nitems_new)
    {
        /* the object does not change; do nothing */
        (*ok) = 1 ;
    }
    else
    {
        /* change the size of the object from nitems_old to nitems_new */
        void *pnew ;
        // pnew = (void *) (SuiteSparse_config.realloc_func) (p, size) ;
        pnew = (void *) c_realloc (p, size) ;
        if (pnew == NULL)
        {
            if (nitems_new < nitems_old)
            {
                /* the attempt to reduce the size of the block failed, but
                   the old block is unchanged.  So pretend to succeed. */
                (*ok) = 1 ;
            }
            else
            {
                /* out of memory */
                (*ok) = 0 ;
            }
        }
        else
        {
            /* success */
            p = pnew ;
            (*ok) = 1 ;
        }
    }
    return (p) ;
}